

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

void find_top_ref(int64_t *ref_frame_rd)

{
  long *in_RDI;
  int64_t cutoff;
  int64_t ref_copy [7];
  long local_50;
  long local_48 [8];
  long *local_8;
  
  local_8 = in_RDI;
  memcpy(local_48,in_RDI + 1,0x38);
  qsort(local_48,7,8,compare_int64);
  local_50 = local_48[0];
  if (local_48[0] != 0x7fffffffffffffff) {
    local_50 = (local_48[0] * 0x6e) / 100;
  }
  *local_8 = local_50;
  return;
}

Assistant:

static inline void find_top_ref(int64_t ref_frame_rd[REF_FRAMES]) {
  assert(ref_frame_rd[0] == INT64_MAX);
  int64_t ref_copy[REF_FRAMES - 1];
  memcpy(ref_copy, ref_frame_rd + 1,
         sizeof(ref_frame_rd[0]) * (REF_FRAMES - 1));
  qsort(ref_copy, REF_FRAMES - 1, sizeof(int64_t), compare_int64);

  int64_t cutoff = ref_copy[0];
  // The cut-off is within 10% of the best.
  if (cutoff != INT64_MAX) {
    assert(cutoff < INT64_MAX / 200);
    cutoff = (110 * cutoff) / 100;
  }
  ref_frame_rd[0] = cutoff;
}